

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Plat_RaiseAndStayTx0
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  undefined4 local_2c;
  EPlatType type;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg3 == 1) {
    local_2c = platRaiseAndStay;
  }
  else if (arg3 == 2) {
    local_2c = platRaiseAndStayLockout;
  }
  else {
    local_2c = platRaiseAndStay;
    if (gameinfo.gametype == GAME_Heretic) {
      local_2c = platRaiseAndStayLockout;
    }
  }
  bVar1 = EV_DoPlat(arg0,(line_t_conflict *)ln,local_2c,0.0,(double)arg1 / 8.0,0,0,1);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Plat_RaiseAndStayTx0)
// Plat_RaiseAndStayTx0 (tag, speed, lockout)
{
	DPlat::EPlatType type;

	switch (arg3)
	{
		case 1:
			type = DPlat::platRaiseAndStay;
			break;
		case 2:
			type = DPlat::platRaiseAndStayLockout;
			break;
		default:
			type = gameinfo.gametype == GAME_Heretic? DPlat::platRaiseAndStayLockout : DPlat::platRaiseAndStay;
			break;
	}


	return EV_DoPlat (arg0, ln, type, 0, SPEED(arg1), 0, 0, 1);
}